

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

int32_t __thiscall wasm::BinaryInstWriter::getBreakIndex(BinaryInstWriter *this,Name name)

{
  pointer pNVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  pNVar1 = (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1;
  if (DAT_010b25a8 == name.super_IString.str._M_str) {
    iVar2 = (int)(uVar3 >> 4);
  }
  else {
    uVar3 = (long)uVar3 >> 4;
    uVar4 = uVar3 & 0xffffffff;
    do {
      uVar4 = uVar4 - 1;
      if ((int)(uint)uVar4 < 0) {
        handle_unreachable("break index not found",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0xc04);
      }
      uVar5 = (uint)uVar4 & 0x7fffffff;
    } while (pNVar1[uVar5].super_IString.str._M_str != name.super_IString.str._M_str);
    iVar2 = (int)uVar3 + ~uVar5;
  }
  return iVar2;
}

Assistant:

int32_t BinaryInstWriter::getBreakIndex(Name name) { // -1 if not found
  if (name == DELEGATE_CALLER_TARGET) {
    return breakStack.size();
  }
  for (int i = breakStack.size() - 1; i >= 0; i--) {
    if (breakStack[i] == name) {
      return breakStack.size() - 1 - i;
    }
  }
  WASM_UNREACHABLE("break index not found");
}